

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

uint64_t cptr_el2_read(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri)

{
  _Bool _Var1;
  int iVar2;
  uint32_t uVar3;
  ulong local_20;
  uint64_t value;
  ARMCPRegInfo_conflict *ri_local;
  CPUARMState_conflict *env_local;
  
  local_20 = (env->cp15).cptr_el[2];
  iVar2 = arm_feature(env,0x21);
  if (iVar2 != 0) {
    _Var1 = arm_el_is_aa64(env,3);
    if (!_Var1) {
      _Var1 = arm_is_secure(env);
      if (!_Var1) {
        uVar3 = extract32((env->cp15).nsacr,10,1);
        if (uVar3 == 0) {
          local_20 = local_20 | 0xc00;
        }
      }
    }
  }
  return local_20;
}

Assistant:

static uint64_t cptr_el2_read(CPUARMState *env, const ARMCPRegInfo *ri)
{
    /*
     * For A-profile AArch32 EL3, if NSACR.CP10
     * is 0 then HCPTR.{TCP11,TCP10} ignore writes and read as 1.
     */
    uint64_t value = env->cp15.cptr_el[2];

    if (arm_feature(env, ARM_FEATURE_EL3) && !arm_el_is_aa64(env, 3) &&
        !arm_is_secure(env) && !extract32(env->cp15.nsacr, 10, 1)) {
        value |= 0x3 << 10;
    }
    return value;
}